

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O3

FT_Error tt_face_load_sbit_image
                   (TT_Face face,FT_ULong strike_index,FT_UInt glyph_index,FT_UInt load_flags,
                   FT_Stream stream,FT_Bitmap *map,TT_SBit_MetricsRec *metrics)

{
  FT_UInt *pFVar1;
  FT_Stream stream_00;
  ulong uVar2;
  FT_Library library;
  long lVar3;
  FT_UShort FVar4;
  FT_UShort FVar5;
  FT_Error FVar6;
  int iVar7;
  FT_ULong FVar8;
  FT_ULong FVar9;
  uint uVar10;
  int iVar11;
  byte local_a4;
  ushort local_9a;
  ulong local_98;
  long local_90;
  FT_Short abearing;
  FT_Stream local_80;
  FT_Bitmap *local_78;
  undefined8 local_70;
  undefined2 local_68;
  FT_Byte local_66;
  FT_ULong local_60;
  FT_ULong FStack_58;
  ulong local_50;
  ulong local_48;
  FT_Byte *local_40;
  FT_Byte *local_38;
  
  if (face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    if (face->ebdt_size == 0) {
      FVar6 = 0x8e;
    }
    else {
      stream_00 = (face->root).stream;
      uVar10 = face->sbit_strike_map[strike_index];
      FVar6 = FT_Stream_Seek(stream_00,face->ebdt_start);
      if (FVar6 == 0) {
        local_78 = &((face->root).glyph)->bitmap;
        local_70 = metrics;
        local_68._0_1_ = '\0';
        local_68._1_1_ = '\0';
        local_60 = face->ebdt_start;
        FStack_58 = face->ebdt_size;
        local_40 = face->sbit_table;
        uVar2 = face->sbit_table_size;
        local_38 = local_40 + uVar2;
        FVar6 = 3;
        if ((ulong)uVar10 * 0x30 + 0x37 <= uVar2) {
          lVar3 = (ulong)uVar10 * 0x30;
          uVar10 = *(uint *)(local_40 + lVar3 + 8);
          local_50 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                            uVar10 << 0x18);
          uVar10 = *(uint *)(local_40 + lVar3 + 0x10);
          local_48 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                            uVar10 << 0x18);
          local_66 = local_40[lVar3 + 0x36];
          if (((local_50 <= uVar2) && (local_48 <= uVar2 - local_50 >> 3)) &&
             (_abearing = face, local_80 = stream_00,
             FVar6 = tt_sbit_decoder_load_image
                               ((TT_SBitDecoder)&abearing,glyph_index,0,0,0,
                                (byte)(load_flags >> 0x16) & 1), FVar6 == 0)) {
LAB_001600ed:
            FVar6 = 0;
            if (((load_flags & 0x500000) == 0) && (FVar6 = 0, map->pixel_mode == '\a')) {
              library = ((face->root).glyph)->library;
              FT_Bitmap_Init((FT_Bitmap *)&abearing);
              FVar6 = FT_Bitmap_Convert(library,map,(FT_Bitmap *)&abearing,1);
              if (FVar6 == 0) {
                map->pixel_mode = local_70._2_1_;
                map->pitch = (int)local_80;
                map->num_grays = (unsigned_short)local_70;
                ft_glyphslot_set_bitmap((face->root).glyph,(FT_Byte *)local_78);
                pFVar1 = &((face->root).glyph)->internal->flags;
                *pFVar1 = *pFVar1 | 1;
              }
              else {
                FT_Bitmap_Done(library,(FT_Bitmap *)&abearing);
              }
            }
          }
        }
      }
    }
  }
  else {
    FVar6 = 2;
    if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
      uVar10 = face->sbit_strike_map[strike_index];
      metrics->height = 0;
      metrics->width = 0;
      if (glyph_index <= (uint)(face->root).num_glyphs) {
        local_a4 = (byte)(load_flags >> 0x16) & 1;
        uVar10 = *(uint *)(face->sbit_table + (ulong)uVar10 * 4 + 8);
        local_98 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                          uVar10 << 0x18);
        local_90 = local_98 + 4;
        iVar11 = 5;
        do {
          if (face->ebdt_size <= local_98) {
            return 3;
          }
          if (face->ebdt_size - local_98 < (ulong)(glyph_index * 4 + 0xc)) {
            return 3;
          }
          FVar6 = FT_Stream_Seek(stream,(ulong)(glyph_index * 4) + local_90 + face->ebdt_start);
          if (FVar6 != 0) {
            return FVar6;
          }
          FVar6 = FT_Stream_EnterFrame(stream,8);
          if (FVar6 != 0) {
            return FVar6;
          }
          FVar8 = FT_Stream_GetULong(stream);
          FVar9 = FT_Stream_GetULong(stream);
          FT_Stream_ExitFrame(stream);
          uVar10 = (uint)FVar9 - (uint)FVar8;
          if (uVar10 == 0) break;
          if ((uint)FVar9 < (uint)FVar8) {
            return 3;
          }
          if (uVar10 < 8) {
            return 3;
          }
          if (face->ebdt_size - local_98 < (FVar9 & 0xffffffff)) {
            return 3;
          }
          FVar6 = FT_Stream_Seek(stream,(FVar8 & 0xffffffff) + local_98 + face->ebdt_start);
          if (FVar6 != 0) {
            return FVar6;
          }
          FVar6 = FT_Stream_EnterFrame(stream,(ulong)uVar10);
          if (FVar6 != 0) {
            return FVar6;
          }
          FVar4 = FT_Stream_GetUShort(stream);
          FVar5 = FT_Stream_GetUShort(stream);
          FVar8 = FT_Stream_GetULong(stream);
          iVar7 = (int)FVar8;
          if (iVar7 != 0x64757065) {
            FVar6 = 2;
            if (iVar7 < 0x7267626c) {
              if (iVar7 == 0x6a706720) goto LAB_0016016f;
              if (iVar7 == 0x706e6720) {
                FVar6 = Load_SBit_Png((face->root).glyph,0,0,0x20,metrics,stream->memory,
                                      stream->cursor,uVar10 - 8,'\x01',local_a4);
                FT_Stream_ExitFrame(stream);
                if (FVar6 != 0) {
                  return FVar6;
                }
                tt_face_get_metrics(face,'\0',glyph_index,&abearing,&local_9a);
                metrics->horiBearingX = FVar4;
                metrics->horiBearingY = metrics->height - FVar5;
                metrics->horiAdvance =
                     (FT_UShort)
                     (((uint)(((face->root).size)->metrics).x_ppem * (uint)local_9a) /
                     (uint)(face->header).Units_Per_EM);
                goto LAB_001600ed;
              }
            }
            else if ((iVar7 == 0x7267626c) || (iVar7 == 0x74696666)) goto LAB_0016016f;
            FVar6 = 7;
LAB_0016016f:
            FT_Stream_ExitFrame(stream);
            return FVar6;
          }
          iVar11 = iVar11 + -1;
          if (iVar11 == 0) {
            FVar6 = 3;
            goto LAB_0016016f;
          }
          FVar4 = FT_Stream_GetUShort(stream);
          glyph_index = (FT_UInt)FVar4;
          FT_Stream_ExitFrame(stream);
        } while ((uint)FVar4 <= (uint)(face->root).num_glyphs);
      }
      FVar6 = 6;
    }
  }
  return FVar6;
}

Assistant:

FT_LOCAL( FT_Error )
  tt_face_load_sbit_image( TT_Face              face,
                           FT_ULong             strike_index,
                           FT_UInt              glyph_index,
                           FT_UInt              load_flags,
                           FT_Stream            stream,
                           FT_Bitmap           *map,
                           TT_SBit_MetricsRec  *metrics )
  {
    FT_Error  error = FT_Err_Ok;


    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        TT_SBitDecoderRec  decoder[1];


        error = tt_sbit_decoder_init( decoder, face, strike_index, metrics );
        if ( !error )
        {
          error = tt_sbit_decoder_load_image(
                    decoder,
                    glyph_index,
                    0,
                    0,
                    0,
                    ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
          tt_sbit_decoder_done( decoder );
        }
      }
      break;

    case TT_SBIT_TABLE_TYPE_SBIX:
      error = tt_face_load_sbix_image(
                face,
                strike_index,
                glyph_index,
                stream,
                map,
                metrics,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      break;

    default:
      error = FT_THROW( Unknown_File_Format );
      break;
    }

    /* Flatten color bitmaps if color was not requested. */
    if ( !error                                        &&
         !( load_flags & FT_LOAD_COLOR )               &&
         !( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) &&
         map->pixel_mode == FT_PIXEL_MODE_BGRA         )
    {
      FT_Bitmap   new_map;
      FT_Library  library = face->root.glyph->library;


      FT_Bitmap_Init( &new_map );

      /* Convert to 8bit grayscale. */
      error = FT_Bitmap_Convert( library, map, &new_map, 1 );
      if ( error )
        FT_Bitmap_Done( library, &new_map );
      else
      {
        map->pixel_mode = new_map.pixel_mode;
        map->pitch      = new_map.pitch;
        map->num_grays  = new_map.num_grays;

        ft_glyphslot_set_bitmap( face->root.glyph, new_map.buffer );
        face->root.glyph->internal->flags |= FT_GLYPH_OWN_BITMAP;
      }
    }

    return error;
  }